

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_dart.cpp
# Opt level: O2

string * __thiscall
flatbuffers::dart::DartGenerator::Filename
          (string *__return_storage_ptr__,DartGenerator *this,string *suffix,bool path)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  undefined7 in_register_00000009;
  allocator<char> local_b2;
  allocator<char> local_b1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  
  if ((int)CONCAT71(in_register_00000009,path) == 0) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_90,"",&local_b1);
  }
  else {
    std::__cxx11::string::string((string *)&local_90,(string *)(this->super_BaseGenerator).path_);
  }
  __lhs = (this->super_BaseGenerator).file_name_;
  if (suffix->_M_string_length == 0) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_b0,"",&local_b2);
  }
  else {
    std::operator+(&local_b0,"_",suffix);
  }
  std::operator+(&local_70,__lhs,&local_b0);
  Namer::File(&local_50,&(this->namer_).super_Namer,&local_70,None);
  std::operator+(__return_storage_ptr__,&local_90,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_90);
  return __return_storage_ptr__;
}

Assistant:

std::string Filename(const std::string &suffix, bool path = true) const {
    return (path ? path_ : "") +
           namer_.File(file_name_ + (suffix.empty() ? "" : "_" + suffix));
  }